

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_app.cpp
# Opt level: O2

void unariesFromLabelling(int *inputLabelling,float *outputUnary,int W,int H,int dim)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float *pfVar5;
  int k;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = log(1.0 / (double)dim);
  dVar8 = log(0.30000001192092896 / (double)(dim + -1));
  uVar2 = 0;
  uVar3 = 0;
  if (0 < dim) {
    uVar3 = (ulong)(uint)dim;
  }
  pfVar5 = outputUnary;
  uVar4 = (ulong)(uint)(W * H);
  if (W * H < 1) {
    uVar4 = uVar2;
  }
  for (; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    iVar1 = inputLabelling[uVar2];
    if ((long)iVar1 < 0) {
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        pfVar5[uVar6] = (float)dVar7;
      }
    }
    else {
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        pfVar5[uVar6] = (float)dVar8;
      }
      outputUnary[uVar2 * (long)dim + (long)iVar1] = -0.35667497;
    }
    pfVar5 = pfVar5 + dim;
  }
  return;
}

Assistant:

void unariesFromLabelling(const int *inputLabelling, float *outputUnary, int W, int H, int dim) {
    const float GT_PROB = 0.7;
    const float u_energy = log(1.0 / dim);
    const float n_energy = log((1.0 - GT_PROB) / (dim - 1));
    const float p_energy = log(GT_PROB);

    for (int i = 0; i < W*H; i++) {
        if (inputLabelling[i] >= 0) {
            for (int k = 0; k < dim; k++) {
                outputUnary[i*dim + k] = n_energy;
            }
            outputUnary[i*dim + inputLabelling[i]] = p_energy;
        }
        else {
            for (int k = 0; k < dim; k++) {
                outputUnary[i*dim + k] = u_energy;
            }
        }
    }
}